

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ProceduralBlockSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind - AlwaysBlock < 4) || (kind == FinalBlock)) || (kind == InitialBlock)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ProceduralBlockSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::InitialBlock:
            return true;
        default:
            return false;
    }
}